

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_on_connect(intptr_t uuid,void *udata)

{
  fio_protocol_s *protocol_;
  fio_ch_set__ordered_s_ *pfVar1;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  cluster_data.uuid = uuid;
  fio_lock(&fio_postoffice.pubsub.lock);
  for (pfVar1 = fio_postoffice.pubsub.channels.ordered;
      (pfVar1 != (fio_ch_set__ordered_s_ *)0x0 &&
      (pfVar1 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos));
      pfVar1 = pfVar1 + 1) {
    if (pfVar1->hash != 0) {
      fio_cluster_inform_root_about_channel(pfVar1->obj,1);
    }
  }
  LOCK();
  fio_postoffice.pubsub.lock = '\0';
  UNLOCK();
  fio_lock(&fio_postoffice.patterns.lock);
  for (pfVar1 = fio_postoffice.patterns.channels.ordered;
      (pfVar1 != (fio_ch_set__ordered_s_ *)0x0 &&
      (pfVar1 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos));
      pfVar1 = pfVar1 + 1) {
    if (pfVar1->hash != 0) {
      fio_cluster_inform_root_about_channel(pfVar1->obj,1);
    }
  }
  LOCK();
  fio_postoffice.patterns.lock = '\0';
  UNLOCK();
  protocol_ = fio_cluster_protocol_alloc(uuid,fio_cluster_client_handler,fio_cluster_client_sender);
  fio_attach__internal((void *)uuid,protocol_);
  return;
}

Assistant:

static void fio_cluster_on_connect(intptr_t uuid, void *udata) {
  cluster_data.uuid = uuid;

  /* inform root about all existing channels */
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.patterns.lock);

  fio_attach(uuid, fio_cluster_protocol_alloc(uuid, fio_cluster_client_handler,
                                              fio_cluster_client_sender));
  (void)udata;
}